

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O1

Variant * Jinx::Impl::IsEmpty(Variant *__return_storage_ptr__,ScriptPtr *param_1,Parameters *params)

{
  ValueType VVar1;
  Variant *this;
  long lVar2;
  String local_40;
  
  this = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
         super__Vector_impl_data._M_start;
  VVar1 = this->m_type;
  if (VVar1 == String) {
    Variant::GetString_abi_cxx11_(&local_40,this);
    __return_storage_ptr__->m_type = Null;
    Variant::Destroy(__return_storage_ptr__);
    __return_storage_ptr__->m_type = Boolean;
    (__return_storage_ptr__->field_1).m_boolean =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length ==
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
                (&local_40,local_40.field_2._M_allocated_capacity);
    }
  }
  else {
    if (VVar1 == Buffer) {
      Variant::GetBuffer((Variant *)&local_40);
      lVar2 = *(long *)(local_40._M_dataplus._M_p + 8);
    }
    else {
      if (VVar1 != Collection) {
        __return_storage_ptr__->m_type = Null;
        Variant::Destroy(__return_storage_ptr__);
        __return_storage_ptr__->m_type = Null;
        return __return_storage_ptr__;
      }
      Variant::GetCollection((Variant *)&local_40);
      lVar2 = *(long *)(local_40._M_dataplus._M_p + 0x28);
    }
    __return_storage_ptr__->m_type = Null;
    Variant::Destroy(__return_storage_ptr__);
    __return_storage_ptr__->m_type = Boolean;
    (__return_storage_ptr__->field_1).m_boolean = lVar2 == 0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Variant IsEmpty(ScriptPtr, const Parameters & params)
	{
		switch (params[0].GetType())
		{
		case ValueType::Collection:
			return params[0].GetCollection()->empty();
		case ValueType::String:
			return params[0].GetString().empty();
		case ValueType::Buffer:
			return params[0].GetBuffer()->Size() == 0;
		default:
			break;
		}
		return nullptr;
	}